

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataCollection::InitializeChunk
          (TupleDataCollection *this,DataChunk *chunk,vector<unsigned_long,_true> *columns)

{
  int iVar1;
  const_reference pvVar2;
  const_reference other;
  reference this_00;
  TupleDataAllocator *pTVar3;
  undefined4 extraout_var;
  idx_t i;
  ulong __n;
  vector<duckdb::LogicalType,_true> chunk_types;
  allocator_type local_49;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             (long)(columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_49);
  for (__n = 0; __n < (ulong)((long)(columns->
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(columns->
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar2 = vector<unsigned_long,_true>::get<true>(columns,__n);
    other = vector<duckdb::LogicalType,_true>::get<true>(&this->layout->types,*pvVar2);
    this_00 = vector<duckdb::LogicalType,_true>::get<true>
                        ((vector<duckdb::LogicalType,_true> *)&local_48,__n);
    LogicalType::operator=(this_00,other);
  }
  pTVar3 = shared_ptr<duckdb::TupleDataAllocator,_true>::operator->(&this->allocator);
  iVar1 = (*pTVar3->buffer_manager->_vptr_BufferManager[0x14])();
  DataChunk::Initialize
            (chunk,(Allocator *)CONCAT44(extraout_var,iVar1),
             (vector<duckdb::LogicalType,_true> *)&local_48,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  return;
}

Assistant:

void TupleDataCollection::InitializeChunk(DataChunk &chunk, const vector<column_t> &columns) const {
	vector<LogicalType> chunk_types(columns.size());
	// keep the order of the columns
	for (idx_t i = 0; i < columns.size(); i++) {
		auto column_idx = columns[i];
		D_ASSERT(column_idx < layout.ColumnCount());
		chunk_types[i] = layout.GetTypes()[column_idx];
	}
	chunk.Initialize(allocator->GetAllocator(), chunk_types);
}